

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo1.cpp
# Opt level: O2

int64_t primecount::pi_lmo1(int64_t x)

{
  long lVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  int64_t iVar6;
  long res;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 in_R9B;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  double dVar15;
  long local_98;
  type primes;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  
  if (x < 2) {
    iVar6 = 0;
  }
  else {
    dVar15 = cbrt((double)x);
    uVar7 = (ulong)dVar15;
    uVar12 = (long)uVar7 >> 0x3f & uVar7;
    for (; (uVar13 = uVar12, 0 < (long)uVar7 &&
           (uVar13 = uVar7,
           uVar7 * uVar7 - (ulong)x / uVar7 != 0 &&
           (long)((ulong)x / uVar7) <= (long)(uVar7 * uVar7))); uVar7 = uVar7 - 1) {
    }
    uVar7 = uVar13 - 1;
    do {
      uVar12 = uVar7;
      lVar14 = uVar12 + 2;
      uVar7 = uVar12 + 1;
    } while (lVar14 * lVar14 - x / lVar14 == 0 || lVar14 * lVar14 < x / lVar14);
    if (uVar7 < 0x14) {
      uVar12 = (ulong)(byte)PhiTiny::pi[uVar12 + 1];
    }
    else {
      uVar12 = 8;
    }
    generate_primes_i32(&primes,uVar7);
    generate_lpf(&lpf,uVar7);
    generate_moebius(&mu,uVar7);
    lVar14 = (long)primes.end_ - (long)primes.array_;
    bVar4 = is_print();
    lVar14 = (lVar14 >> 2) + -1;
    uVar9 = (ulong)bVar4;
    uVar5 = P2((primecount *)x,uVar7,lVar14,1,(uint)bVar4,(bool)in_R9B);
    local_98 = 0;
    uVar13 = 0;
    if (0 < (long)uVar7) {
      uVar13 = uVar7;
    }
    for (uVar10 = 1; uVar10 - uVar13 != 1; uVar10 = uVar10 + 1) {
      if (primes.array_[uVar12] < lpf.array_[uVar10]) {
        iVar2 = mu.array_[uVar10];
        iVar6 = phi((primecount *)((ulong)x / uVar10),uVar12,1,0,SUB81(uVar9,0));
        local_98 = local_98 + iVar6 * iVar2;
      }
    }
    lVar11 = 0;
    while (uVar13 = uVar12, uVar12 = uVar13 + 1, (long)uVar12 < lVar14) {
      lVar8 = (long)uVar7 / (long)primes.array_[uVar12];
      while (lVar8 < (long)uVar7) {
        lVar1 = lVar8 + 1;
        lVar3 = lVar8 + 1;
        lVar8 = lVar1;
        if (primes.array_[uVar12] < lpf.array_[lVar3]) {
          iVar2 = mu.array_[lVar1];
          iVar6 = phi((primecount *)(x / (primes.array_[uVar12] * lVar1)),uVar13,1,0,SUB81(uVar9,0))
          ;
          lVar11 = lVar11 - iVar6 * iVar2;
        }
      }
    }
    iVar6 = local_98 + lVar11 + lVar14 + ~uVar5;
    Vector<int,_std::allocator<int>_>::~Vector(&mu);
    Vector<int,_std::allocator<int>_>::~Vector(&lpf);
    Vector<int,_std::allocator<int>_>::~Vector(&primes);
  }
  return iVar6;
}

Assistant:

int64_t pi_lmo1(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  int64_t y = iroot<3>(x);
  int64_t c = PhiTiny::get_c(y);
  int64_t s1 = 0;
  int64_t s2 = 0;

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);
  bool is_print = false;

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);

  // ordinary leaves
  for (int64_t n = 1; n <= y; n++)
    if (lpf[n] > primes[c])
      s1 += mu[n] * phi(x / n, c, threads, is_print);

  // special leaves
  for (int64_t b = c + 1; b < pi_y; b++)
    for (int64_t m = (y / primes[b]) + 1; m <= y; m++)
      if (lpf[m] > primes[b])
        s2 -= mu[m] * phi(x / (primes[b] * m), b - 1, threads, is_print);

  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}